

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quark.c
# Opt level: O0

void qrk_load(qrk_t *qrk,FILE *file)

{
  int iVar1;
  char *__ptr;
  FILE *in_RSI;
  char *str;
  uint64_t n;
  uint64_t cnt;
  char *in_stack_00000060;
  qrk_t *in_stack_00000068;
  FILE *file_00;
  FILE *local_18;
  FILE *local_10;
  
  local_18 = (FILE *)0x0;
  local_10 = in_RSI;
  iVar1 = __isoc99_fscanf(in_RSI,"#qrk#%lu\n",&local_18);
  if (iVar1 != 1) {
    iVar1 = ferror(local_10);
    if (iVar1 != 0) {
      pfatal("cannot read from file");
    }
    pfatal("invalid format");
  }
  for (file_00 = (FILE *)0x0; file_00 < local_18; file_00 = (FILE *)((long)&file_00->_flags + 1)) {
    __ptr = ns_readstr(file_00);
    qrk_str2id(in_stack_00000068,in_stack_00000060);
    free(__ptr);
  }
  return;
}

Assistant:

void qrk_load(qrk_t *qrk, FILE *file) {
	uint64_t cnt = 0;
	if (fscanf(file, "#qrk#%"SCNu64"\n", &cnt) != 1) {
		if (ferror(file) != 0)
			pfatal("cannot read from file");
		pfatal("invalid format");
	}
	for (uint64_t n = 0; n < cnt; ++n) {
		char *str = ns_readstr(file);
		qrk_str2id(qrk, str);
		free(str);
	}
}